

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimTest(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Sfm_Tim_t *p_00;
  Sfm_Tim_t *p;
  Mio_Library_t *pLib;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Sfm_TimStart((Mio_Library_t *)pNtk->pManFunc,(Scl_Con_t *)0x0,pNtk,100);
  iVar1 = p_00->Delay;
  uVar2 = Sfm_TimCriticalPath(p_00,1);
  uVar3 = Abc_NtkNodeNum(p_00->pNtk);
  printf("Max delay = %.2f.  Path = %d (%d).\n",(double)iVar1 * 0.001,(ulong)uVar2,(ulong)uVar3);
  Sfm_TimStop(p_00);
  return;
}

Assistant:

void Sfm_TimTest( Abc_Ntk_t * pNtk )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    Sfm_Tim_t * p = Sfm_TimStart( pLib, NULL, pNtk, 100 );
    printf( "Max delay = %.2f.  Path = %d (%d).\n", MIO_NUMINV*p->Delay, Sfm_TimCriticalPath(p, 1), Abc_NtkNodeNum(p->pNtk) );
    Sfm_TimStop( p );
}